

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void CChat::ConChat(IResult *pResult,void *pUserData)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  long *plVar4;
  int iStack_20;
  
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  iVar1 = str_comp(pcVar3,"all");
  if (iVar1 == 0) {
    iStack_20 = 1;
  }
  else {
    iVar1 = str_comp(pcVar3,"team");
    if (iVar1 != 0) {
      iVar1 = str_comp(pcVar3,"whisper");
      if (iVar1 == 0) {
        if (pResult->m_NumArgs == 2) {
          uVar2 = (*pResult->_vptr_IResult[2])(pResult,1);
        }
        else {
          for (iVar1 = 0; uVar2 = *(uint *)((long)pUserData + 0x25c48), iVar1 != 0x40;
              iVar1 = iVar1 + 1) {
            uVar2 = (int)(*(uint *)((long)pUserData + 0x25c48) + iVar1) % 0x40;
            if ((*(char *)(*(long *)((long)pUserData + 8) + 0x4aec + (long)(int)uVar2 * 0x5b0) ==
                 '\x01') && (*(uint *)(*(long *)((long)pUserData + 8) + 0x1b140) != uVar2)) break;
          }
        }
        if (((uVar2 < 0x40) &&
            (*(char *)(*(long *)((long)pUserData + 8) + 0x4aec + (ulong)uVar2 * 0x5b0) == '\x01'))
           && (*(uint *)(*(long *)((long)pUserData + 8) + 0x1b140) != uVar2)) {
          *(uint *)((long)pUserData + 0x25c48) = uVar2;
          iStack_20 = 3;
          goto LAB_0012d895;
        }
        if (pResult->m_NumArgs != 2) {
          return;
        }
        plVar4 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar4 + 200);
        pcVar3 = "please enter a valid ClientID";
      }
      else {
        plVar4 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar4 + 200);
        pcVar3 = "expected all, team or whisper as mode";
      }
      (*UNRECOVERED_JUMPTABLE)(plVar4,0,"console",pcVar3,0);
      return;
    }
    iStack_20 = 2;
  }
LAB_0012d895:
  EnableMode((CChat *)pUserData,iStack_20,(char *)0x0);
  return;
}

Assistant:

void CChat::ConChat(IConsole::IResult *pResult, void *pUserData)
{
	CChat *pChat = (CChat *)pUserData;

	const char *pMode = pResult->GetString(0);
	if(str_comp(pMode, "all") == 0)
		pChat->EnableMode(CHAT_ALL);
	else if(str_comp(pMode, "team") == 0)
		pChat->EnableMode(CHAT_TEAM);
	else if(str_comp(pMode, "whisper") == 0)
	{
		int Target = pChat->m_WhisperTarget; // default to ID of last target
		if(pResult->NumArguments() == 2)
			Target = pResult->GetInteger(1);
		else
		{
			// pick next valid player as target
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				int ClientID = (Target + i) % MAX_CLIENTS;
				if(pChat->m_pClient->m_aClients[ClientID].m_Active && pChat->m_pClient->m_LocalClientID != ClientID)
				{
					Target = ClientID;
					break;
				}
			}
		}
		if(Target < 0 || Target >= MAX_CLIENTS || !pChat->m_pClient->m_aClients[Target].m_Active || pChat->m_pClient->m_LocalClientID == Target)
		{
			if(pResult->NumArguments() == 2)
				pChat->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "please enter a valid ClientID");
		}
		else
		{
			pChat->m_WhisperTarget = Target;
			pChat->EnableMode(CHAT_WHISPER);
		}
	}
	else
		((CChat*)pUserData)->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "expected all, team or whisper as mode");
}